

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int saveAllCursors(BtShared *pBt,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  BtCursor *pCur;
  
  pCur = pBt->pCursor;
  while( true ) {
    if (pCur == (BtCursor *)0x0) {
      if (pExcept != (BtCursor *)0x0) {
        pExcept->curFlags = pExcept->curFlags & 0xdf;
      }
      return 0;
    }
    if ((pCur != pExcept) && ((iRoot == 0 || (pCur->pgnoRoot == iRoot)))) break;
    pCur = pCur->pNext;
  }
  do {
    if ((pCur != pExcept) && ((iRoot == 0 || (pCur->pgnoRoot == iRoot)))) {
      if ((pCur->eState & 0xfd) == 0) {
        iVar1 = saveCursorPosition(pCur);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        btreeReleaseAllCursorPages(pCur);
      }
    }
    pCur = pCur->pNext;
  } while (pCur != (BtCursor *)0x0);
  return 0;
}

Assistant:

static int saveAllCursors(BtShared *pBt, Pgno iRoot, BtCursor *pExcept){
  BtCursor *p;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pExcept==0 || pExcept->pBt==pBt );
  for(p=pBt->pCursor; p; p=p->pNext){
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ) break;
  }
  if( p ) return saveCursorsOnList(p, iRoot, pExcept);
  if( pExcept ) pExcept->curFlags &= ~BTCF_Multiple;
  return SQLITE_OK;
}